

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O1

void __thiscall
duckdb::StreamingWindowState::Initialize
          (StreamingWindowState *this,ClientContext *context,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  DataChunk *this_00;
  ExpressionType EVar1;
  long lVar2;
  ulong uVar3;
  ClientContext *pCVar4;
  Vector *pVVar5;
  StreamingWindowState *pSVar6;
  DataChunk *this_01;
  pointer pVVar7;
  pointer ppEVar8;
  const_reference this_02;
  type pEVar9;
  BoundWindowExpression *wexpr;
  LeadLagState *this_03;
  __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
  *this_04;
  reference this_05;
  pointer pLVar10;
  ulong uVar11;
  AggregateState *this_06;
  __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
  *this_07;
  reference pvVar12;
  Allocator *pAVar13;
  pointer pEVar14;
  Vector *pVVar15;
  default_delete<duckdb::Vector> *pdVar16;
  size_type __n;
  initializer_list<duckdb::LogicalType> __l;
  DataChunk result;
  ExpressionExecutor executor;
  allocator_type local_149;
  ClientContext *local_148;
  Vector *local_140 [3];
  StreamingWindowState *local_128;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_120;
  DataChunk *local_118;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
  *local_110;
  DataChunk local_108;
  ExpressionExecutor local_c8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_80;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
  *local_78;
  Value local_70;
  
  local_120 = &this->const_vectors;
  local_148 = context;
  local_118 = input;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::resize(&local_120->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_78 = &this->aggregate_states;
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ::resize(&local_78->
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_110 = &this->lead_lag_states;
  local_128 = this;
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ::resize(&local_110->
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    local_80 = expressions;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](expressions,__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_02);
      wexpr = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar9->super_BaseExpression);
      pCVar4 = local_148;
      EVar1 = (pEVar9->super_BaseExpression).type;
      switch(EVar1) {
      case WINDOW_RANK:
      case WINDOW_RANK_DENSE:
        Value::Value((Value *)&local_c8,1);
        pVVar15 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar15,(Value *)&local_c8);
        local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar15;
        pdVar16 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
        goto LAB_01674556;
      case WINDOW_NTILE:
      case WINDOW_CUME_DIST:
      case WINDOW_ROW_NUMBER:
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
      case WINDOW_LAST_VALUE:
        break;
      case WINDOW_PERCENT_RANK:
        Value::Value((Value *)&local_c8,0.0);
        pVVar15 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar15,(Value *)&local_c8);
        local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar15;
        pdVar16 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
LAB_01674556:
        pVVar7 = local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (Vector *)0x0;
        pVVar15 = *(Vector **)pdVar16;
        *(pointer *)pdVar16 = pVVar7;
        if (pVVar15 != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()(pdVar16,pVVar15);
        }
        if (local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_108,
                     local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        local_108.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        Value::~Value((Value *)&local_c8);
        break;
      case WINDOW_FIRST_VALUE:
        ExpressionExecutor::ExpressionExecutor(&local_c8,local_148);
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&wexpr->children,0);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar12);
        ExpressionExecutor::AddExpression(&local_c8,pEVar9);
        DataChunk::DataChunk(&local_108);
        pAVar13 = Allocator::Get(local_148);
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&wexpr->children,0);
        pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar12);
        LogicalType::LogicalType((LogicalType *)local_140,&pEVar14->return_type);
        __l._M_len = 1;
        __l._M_array = (iterator)local_140;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,
                   __l,&local_149);
        DataChunk::Initialize
                  (&local_108,pAVar13,(vector<duckdb::LogicalType,_true> *)&local_70,0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
        LogicalType::~LogicalType((LogicalType *)local_140);
        ExpressionExecutor::Execute(&local_c8,local_118,&local_108);
        DataChunk::GetValue(&local_70,&local_108,0,0);
        pVVar15 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar15,&local_70);
        local_140[0] = pVVar15;
        pdVar16 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
        pVVar5 = local_140[0];
        local_140[0] = (Vector *)0x0;
        pVVar15 = *(Vector **)pdVar16;
        *(Vector **)pdVar16 = pVVar5;
        if (pVVar15 != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()(pdVar16,pVVar15);
        }
        if (local_140[0] != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)local_140,local_140[0]);
        }
        local_140[0] = (Vector *)0x0;
        Value::~Value(&local_70);
        DataChunk::~DataChunk(&local_108);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
        ::~vector(&local_c8.states.
                   super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                 );
        if ((AggregateState *)
            local_c8.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (AggregateState *)0x0) {
          operator_delete(local_c8.expressions.
                          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          .
                          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      case WINDOW_LEAD:
      case WINDOW_LAG:
        this_03 = (LeadLagState *)operator_new(0x1b0);
        LeadLagState::LeadLagState(this_03,local_148,wexpr);
        local_c8.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
        this_04 = (__uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
                   *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                     ::operator[](local_110,__n);
        ppEVar8 = local_c8.expressions.
                  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  .
                  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c8.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
        ::reset(this_04,(pointer)ppEVar8);
        ppEVar8 = local_c8.expressions.
                  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  .
                  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((AggregateState *)
            local_c8.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (AggregateState *)0x0) {
          LeadLagState::~LeadLagState
                    ((LeadLagState *)
                     local_c8.expressions.
                     super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                     .
                     super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(ppEVar8);
        }
        this_05 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                  ::operator[](local_110,__n);
        pLVar10 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                  ::operator->(this_05);
        lVar2 = pLVar10->offset;
        if (lVar2 < 0) {
          uVar3 = local_128->lead_count;
          uVar11 = -lVar2;
          if ((ulong)-lVar2 < uVar3 || -uVar3 == lVar2) {
            uVar11 = uVar3;
          }
          local_128->lead_count = uVar11;
        }
        break;
      default:
        if (EVar1 == WINDOW_AGGREGATE) {
          pAVar13 = local_128->allocator;
          this_06 = (AggregateState *)operator_new(0x360);
          AggregateState::AggregateState(this_06,pCVar4,wexpr,pAVar13);
          local_c8.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)this_06;
          this_07 = (__uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
                     *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                       ::operator[](local_78,__n);
          ppEVar8 = local_c8.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_c8.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
          ::reset(this_07,(pointer)ppEVar8);
          ppEVar8 = local_c8.expressions.
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          expressions = local_80;
          if ((AggregateState *)
              local_c8.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (AggregateState *)0x0) {
            AggregateState::~AggregateState
                      ((AggregateState *)
                       local_c8.expressions.
                       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       .
                       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(ppEVar8);
            expressions = local_80;
          }
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_01 = local_118;
  pSVar6 = local_128;
  if (local_128->lead_count != 0) {
    this_00 = &local_128->delayed;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_c8,local_118);
    pCVar4 = local_148;
    DataChunk::Initialize
              (this_00,local_148,(vector<duckdb::LogicalType,_true> *)&local_c8,
               pSVar6->lead_count + 0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c8);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_c8,this_01);
    DataChunk::Initialize
              (&pSVar6->shifted,pCVar4,(vector<duckdb::LogicalType,_true> *)&local_c8,
               pSVar6->lead_count + 0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_c8);
  }
  pSVar6->initialized = true;
  return;
}

Assistant:

void Initialize(ClientContext &context, DataChunk &input, const vector<unique_ptr<Expression>> &expressions) {
		const_vectors.resize(expressions.size());
		aggregate_states.resize(expressions.size());
		lead_lag_states.resize(expressions.size());

		for (idx_t expr_idx = 0; expr_idx < expressions.size(); expr_idx++) {
			auto &expr = *expressions[expr_idx];
			auto &wexpr = expr.Cast<BoundWindowExpression>();
			switch (expr.GetExpressionType()) {
			case ExpressionType::WINDOW_AGGREGATE:
				aggregate_states[expr_idx] = make_uniq<AggregateState>(context, wexpr, allocator);
				break;
			case ExpressionType::WINDOW_FIRST_VALUE: {
				// Just execute the expression once
				ExpressionExecutor executor(context);
				executor.AddExpression(*wexpr.children[0]);
				DataChunk result;
				result.Initialize(Allocator::Get(context), {wexpr.children[0]->return_type});
				executor.Execute(input, result);

				const_vectors[expr_idx] = make_uniq<Vector>(result.GetValue(0, 0));
				break;
			}
			case ExpressionType::WINDOW_PERCENT_RANK: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((double)0));
				break;
			}
			case ExpressionType::WINDOW_RANK:
			case ExpressionType::WINDOW_RANK_DENSE: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((int64_t)1));
				break;
			}
			case ExpressionType::WINDOW_LAG:
			case ExpressionType::WINDOW_LEAD: {
				lead_lag_states[expr_idx] = make_uniq<LeadLagState>(context, wexpr);
				const auto offset = lead_lag_states[expr_idx]->offset;
				if (offset < 0) {
					lead_count = MaxValue<idx_t>(idx_t(-offset), lead_count);
				}
				break;
			}
			default:
				break;
			}
		}
		if (lead_count) {
			delayed.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
			shifted.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
		}
		initialized = true;
	}